

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive_list_column.h
# Opt level: O1

bool Gudhi::persistence_matrix::operator<
               (Intrusive_list_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>
                *c1,Intrusive_list_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>
                    *c2)

{
  uint uVar1;
  uint uVar2;
  node_ptr plVar3;
  node_ptr plVar4;
  
  if (c1 != c2) {
    plVar4 = (c1->column_).super_type.data_.root_plus_size_.m_header.super_node.next_;
    plVar3 = (c2->column_).super_type.data_.root_plus_size_.m_header.super_node.next_;
    while( true ) {
      if (plVar4 == (node_ptr)&c1->column_) {
        return plVar3 != (node_ptr)&c2->column_;
      }
      if (plVar3 == (node_ptr)&c2->column_) break;
      uVar1 = *(uint *)&plVar3[1].next_;
      uVar2 = *(uint *)&plVar4[1].next_;
      if (uVar1 < uVar2) {
        return false;
      }
      if (uVar1 >= uVar2 && uVar1 != uVar2) {
        return true;
      }
      plVar4 = plVar4->next_;
      plVar3 = plVar3->next_;
    }
  }
  return false;
}

Assistant:

bool operator<(const Intrusive_list_column& c1, const Intrusive_list_column& c2) {
    if (&c1 == &c2) return false;

    if constexpr (Master_matrix::Option_list::is_z2) {
      return c1.column_ < c2.column_;
    } else {
      auto it1 = c1.column_.begin();
      auto it2 = c2.column_.begin();
      while (it1 != c1.column_.end() && it2 != c2.column_.end()) {
        if (it1->get_row_index() != it2->get_row_index()) return it1->get_row_index() < it2->get_row_index();
        if (it1->get_element() != it2->get_element()) return it1->get_element() < it2->get_element();
        ++it1;
        ++it2;
      }
      return it2 != c2.column_.end();
    }
  }